

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_resampler.cpp
# Opt level: O0

void is_seq<float>(float *array,int stride,long count,long expected_start)

{
  bool bVar1;
  Message *this;
  char *message;
  long in_RCX;
  long in_RDX;
  int in_ESI;
  AssertionResult gtest_ar;
  int j;
  long i;
  uint32_t output_index;
  AssertHelper in_stack_ffffffffffffffa0;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_ffffffffffffffa8;
  char *in_stack_ffffffffffffffb8;
  int local_34;
  long local_30;
  
  local_30 = 0;
  do {
    if (in_RDX <= local_30) {
      return;
    }
    for (local_34 = 0; local_34 < in_ESI; local_34 = local_34 + 1) {
      this = (Message *)(in_RCX + local_30);
      testing::internal::EqHelper<false>::Compare<float,long>
                (in_stack_ffffffffffffffb8,(char *)this,(float *)in_stack_ffffffffffffffa8.ptr_,
                 (long *)in_stack_ffffffffffffffa0.data_);
      bVar1 = testing::AssertionResult::operator_cast_to_bool
                        ((AssertionResult *)&stack0xffffffffffffffb8);
      if (!bVar1) {
        testing::Message::Message(this);
        message = testing::AssertionResult::failure_message((AssertionResult *)0x10ff06);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&stack0xffffffffffffffa0,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kinetiknz[P]cubeb/test/test_resampler.cpp"
                   ,0x290,message);
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)&stack0xffffffffffffffa0,(Message *)&stack0xffffffffffffffa8);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xffffffffffffffa0);
        testing::Message::~Message((Message *)0x10ff47);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x10ff63);
      if (!bVar1) {
        return;
      }
    }
    local_30 = local_30 + 1;
  } while( true );
}

Assistant:

void is_seq(T * array, int stride, long count, long expected_start)
{
  uint32_t output_index = 0;
  for (long i = 0; i < count; i++) {
    for (int j = 0; j < stride; j++) {
      ASSERT_EQ(array[output_index + j], expected_start + i);
    }
    output_index += stride;
  }
}